

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

Instr * __thiscall
Inline::InlineGetterSetterFunction
          (Inline *this,Instr *accessorInstr,FunctionJITTimeInfo *inlineeData,
          StackSym *symCallerThis,uint inlineCacheIndex,bool isGetter,bool *pIsInlined,
          uint recursiveInlineDepth)

{
  PropertyId propertyId;
  code *pcVar1;
  Func *polymorphicInlineCacheInfo;
  bool bVar2;
  ExecutionMode EVar3;
  uint32 postCallByteCodeOffset;
  ScriptContext *pSVar4;
  ThreadContext *pTVar5;
  Opnd *pOVar6;
  undefined4 *puVar7;
  JitArenaAllocator *pJVar8;
  JITTimeWorkItem *pJVar9;
  CodeGenWorkItemIDL *pCVar10;
  intptr_t funcBodyAddr;
  Func *this_00;
  ThreadContextInfo *threadContextInfo;
  ScriptContextInfo *scriptContextInfo;
  JITOutput *this_01;
  JITOutputIDL *outputData;
  JITTimeWorkItem *this_02;
  FunctionJITTimeInfo *pFVar11;
  FunctionJITRuntimeInfo *runtimeInfo;
  void *codeGenAllocators;
  ScriptContextProfiler *codeGenProfiler;
  JITManager *this_03;
  char16 *pcVar12;
  char16 *pcVar13;
  char16 *pcVar14;
  Func *pFVar15;
  PropertyRecord *this_04;
  SymOpnd *pSVar16;
  PropertySymOpnd *methodOpnd_00;
  Instr *pIVar17;
  Opnd *local_340;
  char16_t *local_310;
  char16_t *local_2e8;
  PropertySym *local_2e0;
  bool local_219;
  Opnd *pOStack_218;
  bool safeThis;
  Opnd *methodOpnd;
  PropertySym *propertySym;
  char16 debugStringBuffer2 [42];
  wchar local_1a8 [4];
  char16 debugStringBuffer [42];
  TrackAllocData local_140;
  Func *local_118;
  Func *inlinee;
  JITTimePolymorphicInlineCacheInfo *entryPointPolymorphicInlineCacheInfo;
  undefined8 local_100;
  TrackAllocData local_f8;
  JITTimeWorkItem *local_d0;
  JITTimeWorkItem *jitWorkItem;
  undefined8 local_c0;
  TrackAllocData local_b8;
  CodeGenWorkItemIDL *local_90;
  CodeGenWorkItemIDL *workItemData;
  RegOpnd *pRStack_80;
  RegSlot returnRegSlot;
  RegOpnd *returnValueOpnd;
  Instr *inlineBailoutChecksBeforeInstr;
  JITTimeFunctionBody *funcBody;
  JITTimeFunctionBody *funcCaller;
  Instr *instrNext;
  bool isGetter_local;
  StackSym *pSStack_50;
  uint inlineCacheIndex_local;
  StackSym *symCallerThis_local;
  FunctionJITTimeInfo *inlineeData_local;
  Instr *accessorInstr_local;
  Inline *this_local;
  
  instrNext._3_1_ = isGetter;
  instrNext._4_4_ = inlineCacheIndex;
  pSStack_50 = symCallerThis;
  symCallerThis_local = (StackSym *)inlineeData;
  inlineeData_local = (FunctionJITTimeInfo *)accessorInstr;
  accessorInstr_local = (Instr *)this;
  bVar2 = Func::IsBackgroundJIT(this->topFunc);
  if (!bVar2) {
    pSVar4 = Func::GetScriptContext(this->topFunc);
    pTVar5 = Js::ScriptContext::GetThreadContext(pSVar4);
    pSVar4 = Func::GetScriptContext(this->topFunc);
    ThreadContext::ProbeStackNoDispose(pTVar5,0xc00,pSVar4,(PVOID)0x0);
  }
  *pIsInlined = true;
  funcCaller = (JITTimeFunctionBody *)(inlineeData_local->m_data).inlineesBv;
  funcBody = Func::GetJITFunctionBody((Func *)(inlineeData_local->m_data).sharedPropertyGuards);
  inlineBailoutChecksBeforeInstr =
       (Instr *)FunctionJITTimeInfo::GetBody((FunctionJITTimeInfo *)symCallerThis_local);
  pOVar6 = IR::Instr::GetSrc2((Instr *)inlineeData_local);
  if (pOVar6 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xf90,"(!accessorInstr->GetSrc2())","!accessorInstr->GetSrc2()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  returnValueOpnd = (RegOpnd *)inlineeData_local;
  if (((instrNext._3_1_ & 1) == 0) ||
     (pOVar6 = IR::Instr::GetDst((Instr *)inlineeData_local), pOVar6 == (Opnd *)0x0)) {
    pRStack_80 = (RegOpnd *)0x0;
    workItemData._4_4_ = 0xffffffff;
  }
  else {
    pOVar6 = IR::Instr::UnlinkDst((Instr *)inlineeData_local);
    pRStack_80 = IR::Opnd::AsRegOpnd(pOVar6);
    workItemData._4_4_ = StackSym::GetByteCodeRegSlot(pRStack_80->m_sym);
  }
  pJVar8 = this->topFunc->m_alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_b8,(type_info *)&CodeGenWorkItemIDL::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
             ,0xfa7);
  pJVar8 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar8,&local_b8);
  jitWorkItem = (JITTimeWorkItem *)Memory::JitArenaAllocator::Alloc;
  local_c0 = 0;
  local_90 = (CodeGenWorkItemIDL *)new<Memory::JitArenaAllocator>(0x60,pJVar8,0x4e98c0);
  bVar2 = Func::IsJitInDebugMode(this->topFunc);
  local_90->isJitInDebugMode = bVar2;
  local_90->type = '\0';
  pJVar9 = Func::GetWorkItem(this->topFunc);
  EVar3 = JITTimeWorkItem::GetJitMode(pJVar9);
  local_90->jitMode = EVar3;
  pJVar9 = Func::GetWorkItem(this->topFunc);
  pCVar10 = JITTimeWorkItem::GetWorkItemData(pJVar9);
  local_90->nativeDataAddr = pCVar10->nativeDataAddr;
  local_90->loopNumber = 0xffffffff;
  local_90->jitData = (FunctionJITTimeDataIDL *)symCallerThis_local;
  pJVar8 = this->topFunc->m_alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_f8,(type_info *)&JITTimeWorkItem::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
             ,0xfb0);
  pJVar8 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar8,&local_f8);
  entryPointPolymorphicInlineCacheInfo =
       (JITTimePolymorphicInlineCacheInfo *)Memory::JitArenaAllocator::Alloc;
  local_100 = 0;
  pJVar9 = (JITTimeWorkItem *)new<Memory::JitArenaAllocator>(0x1e0,pJVar8,0x4e98c0);
  JITTimeWorkItem::JITTimeWorkItem(pJVar9,local_90);
  local_d0 = pJVar9;
  pJVar9 = Func::GetWorkItem(this->topFunc);
  funcBodyAddr = JITTimeFunctionBody::GetAddr((JITTimeFunctionBody *)inlineBailoutChecksBeforeInstr)
  ;
  inlinee = (Func *)JITTimeWorkItem::GetInlineePolymorphicInlineCacheInfo(pJVar9,funcBodyAddr);
  pJVar8 = this->topFunc->m_alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_140,(type_info *)&Func::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
             ,0xfdb);
  pJVar8 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar8,&local_140);
  stack0xfffffffffffffeb0 = Memory::JitArenaAllocator::Alloc;
  this_00 = (Func *)new<Memory::JitArenaAllocator>(0x420,pJVar8,0x4e98c0);
  pJVar9 = local_d0;
  pJVar8 = this->topFunc->m_alloc;
  threadContextInfo = Func::GetThreadContextInfo(this->topFunc);
  scriptContextInfo = Func::GetScriptContextInfo(this->topFunc);
  this_01 = Func::GetJITOutput(this->topFunc);
  outputData = JITOutput::GetOutputData(this_01);
  this_02 = Func::GetWorkItem((Func *)(inlineeData_local->m_data).sharedPropertyGuards);
  pFVar11 = JITTimeWorkItem::GetJITTimeInfo(this_02);
  runtimeInfo = FunctionJITTimeInfo::GetLdFldInlineeRuntimeData(pFVar11,instrNext._4_4_);
  polymorphicInlineCacheInfo = inlinee;
  codeGenAllocators = Func::GetCodeGenAllocators(this->topFunc);
  codeGenProfiler = Func::GetCodeGenProfiler(this->topFunc);
  bVar2 = Func::IsBackgroundJIT(this->topFunc);
  pFVar15 = (Func *)(inlineeData_local->m_data).sharedPropertyGuards;
  postCallByteCodeOffset =
       IR::Instr::GetByteCodeOffset((Instr *)(inlineeData_local->m_data).inlineesBv);
  Func::Func(this_00,pJVar8,pJVar9,threadContextInfo,scriptContextInfo,outputData,
             (EntryPointInfo *)0x0,runtimeInfo,
             (JITTimePolymorphicInlineCacheInfo *)polymorphicInlineCacheInfo,codeGenAllocators,
             codeGenProfiler,bVar2,pFVar15,postCallByteCodeOffset,workItemData._4_4_,false,0xffff,
             true);
  local_118 = this_00;
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlinePhase);
  if (((bVar2) ||
      (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,InlineAccessorsPhase), bVar2)) ||
     (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,InlineAccessorsPhase), bVar2)) {
    if ((instrNext._3_1_ & 1) == 0) {
      pOVar6 = IR::Instr::GetDst((Instr *)inlineeData_local);
      pSVar16 = IR::Opnd::AsSymOpnd(pOVar6);
      local_2e0 = Sym::AsPropertySym(pSVar16->m_sym);
    }
    else {
      pOVar6 = IR::Instr::GetSrc1((Instr *)inlineeData_local);
      pSVar16 = IR::Opnd::AsSymOpnd(pOVar6);
      local_2e0 = Sym::AsPropertySym(pSVar16->m_sym);
    }
    methodOpnd = (Opnd *)local_2e0;
    this_03 = JITManager::GetJITManager();
    bVar2 = JITManager::IsOOPJITEnabled(this_03);
    if (bVar2) {
      if ((instrNext._3_1_ & 1) == 0) {
        local_2e8 = L"es5Setter";
      }
      else {
        local_2e8 = L"es5Getter";
      }
      local_2e8 = local_2e8 + 3;
      pcVar12 = JITTimeFunctionBody::GetDisplayName
                          ((JITTimeFunctionBody *)inlineBailoutChecksBeforeInstr);
      pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                          ((FunctionJITTimeInfo *)symCallerThis_local,(wchar (*) [42])local_1a8);
      pcVar14 = JITTimeFunctionBody::GetDisplayName(funcBody);
      pJVar9 = Func::GetWorkItem((Func *)(inlineeData_local->m_data).sharedPropertyGuards);
      pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pJVar9);
      FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])&propertySym);
      Output::Print(L"INLINING: %s: \tInlinee: %s (%s)\tCaller: %s (%s)\t fieldId: %d\n",local_2e8,
                    pcVar12,pcVar13,pcVar14);
    }
    else {
      if ((instrNext._3_1_ & 1) == 0) {
        local_310 = L"es5Setter";
      }
      else {
        local_310 = L"es5Getter";
      }
      local_310 = local_310 + 3;
      pcVar12 = JITTimeFunctionBody::GetDisplayName
                          ((JITTimeFunctionBody *)inlineBailoutChecksBeforeInstr);
      pcVar13 = FunctionJITTimeInfo::GetDebugNumberSet
                          ((FunctionJITTimeInfo *)symCallerThis_local,(wchar (*) [42])local_1a8);
      pcVar14 = JITTimeFunctionBody::GetDisplayName(funcBody);
      pJVar9 = Func::GetWorkItem((Func *)(inlineeData_local->m_data).sharedPropertyGuards);
      pFVar11 = JITTimeWorkItem::GetJITTimeInfo(pJVar9);
      FunctionJITTimeInfo::GetDebugNumberSet(pFVar11,(wchar (*) [42])&propertySym);
      pFVar15 = PropertySym::GetFunc((PropertySym *)methodOpnd);
      pTVar5 = Func::GetInProcThreadContext(pFVar15);
      propertyId._0_2_ = methodOpnd[1].m_valueType;
      propertyId._2_1_ = methodOpnd[1].m_type;
      propertyId._3_1_ = methodOpnd[1].field_0xb;
      this_04 = ThreadContext::GetPropertyRecord(pTVar5,propertyId);
      Js::PropertyRecord::GetBuffer(this_04);
      Output::Print(L"INLINING: %s: \tInlinee: %s (%s)\tCaller: %s (%s)\t fieldName: %s\n",local_310
                    ,pcVar12,pcVar13,pcVar14);
    }
    Output::Flush();
  }
  if ((instrNext._3_1_ & 1) == 0) {
    local_340 = IR::Instr::GetDst((Instr *)inlineeData_local);
  }
  else {
    local_340 = IR::Instr::GetSrc1((Instr *)inlineeData_local);
  }
  pOStack_218 = local_340;
  bVar2 = IR::Opnd::IsSymOpnd(local_340);
  if (bVar2) {
    pSVar16 = IR::Opnd::AsSymOpnd(pOStack_218);
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar16);
    if (bVar2) goto LAB_0070cae7;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar7 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                     ,0xff7,
                     "(methodOpnd->IsSymOpnd() && methodOpnd->AsSymOpnd()->IsPropertySymOpnd())",
                     "methodOpnd->IsSymOpnd() && methodOpnd->AsSymOpnd()->IsPropertySymOpnd()");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar7 = 0;
LAB_0070cae7:
  pFVar11 = inlineeData_local;
  methodOpnd_00 = IR::Opnd::AsPropertySymOpnd(pOStack_218);
  returnValueOpnd =
       (RegOpnd *)
       SimulateCallForGetterSetter
                 (this,(Instr *)pFVar11,(Instr *)pFVar11,methodOpnd_00,(bool)(instrNext._3_1_ & 1));
  local_219 = false;
  TryOptimizeCallInstrWithFixedMethod
            (this,(Instr *)inlineeData_local,(FunctionJITTimeInfo *)symCallerThis_local,false,false,
             false,true,&local_219,false,0);
  pIVar17 = InlineFunctionCommon
                      (this,(Instr *)inlineeData_local,false,(StackSym *)0x0,
                       (FunctionJITTimeInfo *)symCallerThis_local,local_118,(Instr *)funcCaller,
                       pRStack_80,(Instr *)returnValueOpnd,pSStack_50,recursiveInlineDepth,
                       (bool)(local_219 & 1),false);
  return pIVar17;
}

Assistant:

IR::Instr *
Inline::InlineGetterSetterFunction(IR::Instr *accessorInstr, const FunctionJITTimeInfo *const inlineeData, const StackSym *symCallerThis, const uint inlineCacheIndex, bool isGetter, bool *pIsInlined, uint recursiveInlineDepth)
{
    // This function is recursive, so when jitting in the foreground, probe the stack
    if (!this->topFunc->IsBackgroundJIT())
    {
        PROBE_STACK_NO_DISPOSE(this->topFunc->GetScriptContext(), Js::Constants::MinStackDefault);
    }

    *pIsInlined = true;
    IR::Instr *instrNext = accessorInstr->m_next;

    const JITTimeFunctionBody *funcCaller = accessorInstr->m_func->GetJITFunctionBody();
    JITTimeFunctionBody *funcBody = inlineeData->GetBody();

    Assert(!accessorInstr->GetSrc2());

    JS_ETW(EventWriteJSCRIPT_BACKEND_INLINE(
        funcCaller->GetFunctionNumber(), funcBody->GetFunctionNumber(),
        funcCaller->GetDisplayName(), funcBody->GetDisplayName()));

    IR::Instr *inlineBailoutChecksBeforeInstr = accessorInstr;


    IR::RegOpnd * returnValueOpnd;
    Js::RegSlot returnRegSlot;
    if (isGetter && accessorInstr->GetDst())
    {
        returnValueOpnd = accessorInstr->UnlinkDst()->AsRegOpnd();
        returnRegSlot = returnValueOpnd->m_sym->GetByteCodeRegSlot();
    }
    else
    {
        returnValueOpnd = nullptr;
        returnRegSlot = Js::Constants::NoRegister;
    }

    // inlinee
    CodeGenWorkItemIDL * workItemData = JitAnewStruct(this->topFunc->m_alloc, CodeGenWorkItemIDL);

    workItemData->isJitInDebugMode = this->topFunc->IsJitInDebugMode();
    workItemData->type = JsFunctionType;
    workItemData->jitMode = static_cast<char>(this->topFunc->GetWorkItem()->GetJitMode());
    workItemData->nativeDataAddr = this->topFunc->GetWorkItem()->GetWorkItemData()->nativeDataAddr;
    workItemData->loopNumber = Js::LoopHeader::NoLoop;

    workItemData->jitData = (FunctionJITTimeDataIDL*)(inlineeData);
    JITTimeWorkItem * jitWorkItem = JitAnew(this->topFunc->m_alloc, JITTimeWorkItem, workItemData);

    JITTimePolymorphicInlineCacheInfo * entryPointPolymorphicInlineCacheInfo = this->topFunc->GetWorkItem()->GetInlineePolymorphicInlineCacheInfo(funcBody->GetAddr());
#if !FLOATVAR
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        accessorInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetLdFldInlineeRuntimeData(inlineCacheIndex),
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetNumberAllocator(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        accessorInstr->m_func,
        accessorInstr->m_next->GetByteCodeOffset(),
        returnRegSlot,
        false,
        UINT16_MAX,
        true);
#else
    Func * inlinee = JitAnew(this->topFunc->m_alloc,
        Func,
        this->topFunc->m_alloc,
        jitWorkItem,
        this->topFunc->GetThreadContextInfo(),
        this->topFunc->GetScriptContextInfo(),
        this->topFunc->GetJITOutput()->GetOutputData(),
        nullptr,
        accessorInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetLdFldInlineeRuntimeData(inlineCacheIndex),
        entryPointPolymorphicInlineCacheInfo,
        this->topFunc->GetCodeGenAllocators(),
        this->topFunc->GetCodeGenProfiler(),
        this->topFunc->IsBackgroundJIT(),
        accessorInstr->m_func,
        accessorInstr->m_next->GetByteCodeOffset(),
        returnRegSlot,
        false,
        UINT16_MAX,
        true);
#endif

    // funcBody->GetInParamsCount() can be greater than one even if it is all undefined. Example defineProperty(a,"foo", {get:function(a,b,c){}});

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::InlinePhase) ||
        Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::InlineAccessorsPhase) || Js::Configuration::Global.flags.Trace.IsEnabled(Js::InlineAccessorsPhase))
    {
        char16 debugStringBuffer [MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        PropertySym *propertySym = isGetter ? accessorInstr->GetSrc1()->AsSymOpnd()->m_sym->AsPropertySym() : accessorInstr->GetDst()->AsSymOpnd()->m_sym->AsPropertySym();
        if (JITManager::GetJITManager()->IsOOPJITEnabled())
        {
            Output::Print(_u("INLINING: %s: \tInlinee: %s (%s)\tCaller: %s (%s)\t fieldId: %d\n"), isGetter ? _u("Getter") : _u("Setter"),
                funcBody->GetDisplayName(), inlineeData->GetDebugNumberSet(debugStringBuffer), funcCaller->GetDisplayName(), accessorInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetDebugNumberSet(debugStringBuffer2),
                propertySym->m_propertyId);
        }
        else
        {
            Output::Print(_u("INLINING: %s: \tInlinee: %s (%s)\tCaller: %s (%s)\t fieldName: %s\n"), isGetter ? _u("Getter") : _u("Setter"),
                funcBody->GetDisplayName(), inlineeData->GetDebugNumberSet(debugStringBuffer), funcCaller->GetDisplayName(), accessorInstr->m_func->GetWorkItem()->GetJITTimeInfo()->GetDebugNumberSet(debugStringBuffer2),
                propertySym->GetFunc()->GetInProcThreadContext()->GetPropertyRecord(propertySym->m_propertyId)->GetBuffer());
        }
        Output::Flush();
    }
#endif
    IR::Opnd * methodOpnd = isGetter ? accessorInstr->GetSrc1() : accessorInstr->GetDst();
    Assert(methodOpnd->IsSymOpnd() && methodOpnd->AsSymOpnd()->IsPropertySymOpnd());

    inlineBailoutChecksBeforeInstr = SimulateCallForGetterSetter(accessorInstr, accessorInstr, methodOpnd->AsPropertySymOpnd(), isGetter);

    bool safeThis = false;
    TryOptimizeCallInstrWithFixedMethod(accessorInstr, inlineeData, false, false, false, true, safeThis);

    return InlineFunctionCommon(accessorInstr, false, nullptr, inlineeData, inlinee, instrNext, returnValueOpnd, inlineBailoutChecksBeforeInstr, symCallerThis, recursiveInlineDepth, safeThis);
}